

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O1

Symbol * sym_RedefEqu(char *symName,int32_t value)

{
  Symbol *sym;
  
  sym = (Symbol *)hash_GetElement(symbols,symName);
  if (sym == (Symbol *)0x0) {
    sym = createNonrelocSymbol(symName,true);
    if (sym == (Symbol *)0x0) {
      return (Symbol *)0x0;
    }
  }
  else {
    if ((sym->type | SYM_EQUS) != SYM_REF) {
      error("\'%s\' already defined as non-EQU at ",symName);
      dumpFilename(sym);
      putc(10,_stderr);
      return (Symbol *)0x0;
    }
    if (sym->isBuiltin == true) {
      error("Built-in symbol \'%s\' cannot be redefined\n",symName);
      return (Symbol *)0x0;
    }
    updateSymbolFilename(sym);
  }
  sym->type = SYM_EQU;
  (sym->field_8).value = value;
  return sym;
}

Assistant:

struct Symbol *sym_RedefEqu(char const *symName, int32_t value)
{
	struct Symbol *sym = sym_FindExactSymbol(symName);

	if (!sym)
		return sym_AddEqu(symName, value);

	if (sym_IsDefined(sym) && sym->type != SYM_EQU) {
		error("'%s' already defined as non-EQU at ", symName);
		dumpFilename(sym);
		putc('\n', stderr);
		return NULL;
	} else if (sym->isBuiltin) {
		error("Built-in symbol '%s' cannot be redefined\n", symName);
		return NULL;
	}

	updateSymbolFilename(sym);
	sym->type = SYM_EQU;
	sym->value = value;

	return sym;
}